

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_ABCfunctions.cpp
# Opt level: O1

void __thiscall
chrono::ChFunctionRotation_ABCfunctions::ArchiveIN
          (ChFunctionRotation_ABCfunctions *this,ChArchiveIn *marchive)

{
  int foo;
  AngleSet local_44;
  char *local_40;
  shared_ptr<chrono::ChFunction> *local_38;
  undefined1 local_30;
  
  ChArchiveIn::VersionRead<chrono::ChFunctionRotation_ABCfunctions>(marchive);
  ChFunctionRotation::ArchiveIN(&this->super_ChFunctionRotation,marchive);
  local_38 = &this->angleA;
  local_40 = "angleA";
  local_30 = 0;
  ChArchiveIn::in<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_40);
  local_38 = &this->angleB;
  local_40 = "angleB";
  local_30 = 0;
  ChArchiveIn::in<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_40);
  local_38 = &this->angleC;
  local_40 = "angleC";
  local_30 = 0;
  ChArchiveIn::in<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_40);
  local_40 = "foo";
  local_38 = (shared_ptr<chrono::ChFunction> *)&local_44;
  local_30 = 0;
  (**(code **)(*(long *)marchive + 0x18))(marchive,&local_40);
  this->angleset = local_44;
  return;
}

Assistant:

void ChFunctionRotation_ABCfunctions::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunctionRotation_ABCfunctions>();
	// deserialize parent class
    ChFunctionRotation::ArchiveIN(marchive);
    // deserialize all member data:
    marchive >> CHNVP(angleA);
	marchive >> CHNVP(angleB);
	marchive >> CHNVP(angleC);
	int foo;
	marchive >> CHNVP(foo);
	angleset = (AngleSet)foo;  //***TODO: use CH_ENUM_MAPPER_BEGIN ... END to serialize enum with readable names
}